

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

void __thiscall
dynamicgraph::
Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::set
          (Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,istringstream *stringValue)

{
  string local_30 [32];
  
  std::__cxx11::stringbuf::str();
  (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1f])(this,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Signal<T, Time>::set(std::istringstream &stringValue) {
  (*this) = signal_io<T>::cast(stringValue);
}